

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_pool.hpp
# Opt level: O0

void __thiscall
coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>::collect_free_client
          (client_pool<cinatra::coro_http_client,_coro_io::io_context_pool> *this,
          unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
          *client)

{
  bool bVar1;
  size_t sVar2;
  null_logger_t *pnVar3;
  long in_RDI;
  unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
  *in_stack_000000f8;
  client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
  *in_stack_00000100;
  client_pool<cinatra::coro_http_client,_coro_io::io_context_pool> *in_stack_00000108;
  milliseconds in_stack_00000110;
  unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
  *in_stack_ffffffffffffff58;
  undefined1 __i;
  client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
  *in_stack_ffffffffffffff60;
  pointer local_58;
  undefined8 local_50;
  pointer local_40 [3];
  undefined8 local_28;
  pointer local_18 [3];
  
  std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
  operator->((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
              *)0x45437b);
  bVar1 = cinatra::coro_http_client::has_closed((coro_http_client *)0x454383);
  if (bVar1) {
    pnVar3 = cinatra::null_logger_t::operator<<
                       ((null_logger_t *)&cinatra::NULL_LOGGER,(char (*) [8])0x78f4bd);
    local_58 = std::
               unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
               ::get((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                      *)in_stack_ffffffffffffff60);
    pnVar3 = cinatra::null_logger_t::operator<<(pnVar3,&local_58);
    cinatra::null_logger_t::operator<<(pnVar3,(char (*) [33])"} is closed. we won\'t collect it");
  }
  else {
    sVar2 = coro_io::detail::
            client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
            ::size(in_stack_ffffffffffffff60);
    if (sVar2 < *(uint *)(in_RDI + 0xa28)) {
      pnVar3 = cinatra::null_logger_t::operator<<
                         ((null_logger_t *)&cinatra::NULL_LOGGER,(char (*) [21])0x78f4b0);
      local_18[0] = std::
                    unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                    ::get((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                           *)in_stack_ffffffffffffff60);
      pnVar3 = cinatra::null_logger_t::operator<<(pnVar3,local_18);
      cinatra::null_logger_t::operator<<(pnVar3,(char (*) [10])"} enqueue");
      std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
      unique_ptr((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                  *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      __i = (undefined1)((ulong)in_stack_ffffffffffffff58 >> 0x38);
      local_28 = *(undefined8 *)(in_RDI + 0xa40);
      enqueue(in_stack_00000108,in_stack_00000100,in_stack_000000f8,in_stack_00000110);
      std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
      ~unique_ptr((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                   *)in_stack_ffffffffffffff60);
    }
    else {
      pnVar3 = cinatra::null_logger_t::operator<<
                         ((null_logger_t *)&cinatra::NULL_LOGGER,
                          (char (*) [31])"out of max connection limit <<");
      pnVar3 = cinatra::null_logger_t::operator<<(pnVar3,(uint *)(in_RDI + 0xa28));
      in_stack_ffffffffffffff60 =
           (client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
            *)cinatra::null_logger_t::operator<<(pnVar3,(char (*) [23])", collect free client{");
      local_40[0] = std::
                    unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                    ::get((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                           *)in_stack_ffffffffffffff60);
      pnVar3 = cinatra::null_logger_t::operator<<
                         ((null_logger_t *)in_stack_ffffffffffffff60,local_40);
      cinatra::null_logger_t::operator<<(pnVar3,(char (*) [30])"} enqueue short connect queue");
      std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
      unique_ptr((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                  *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      __i = (undefined1)((ulong)in_stack_ffffffffffffff58 >> 0x38);
      local_50 = *(undefined8 *)(in_RDI + 0xa48);
      enqueue(in_stack_00000108,in_stack_00000100,in_stack_000000f8,in_stack_00000110);
      std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>::
      ~unique_ptr((unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                   *)in_stack_ffffffffffffff60);
    }
    std::atomic<bool>::operator=((atomic<bool> *)in_stack_ffffffffffffff60,(bool)__i);
  }
  return;
}

Assistant:

void collect_free_client(std::unique_ptr<client_t> client) {
    if (!client->has_closed()) {
      if (free_clients_.size() < pool_config_.max_connection) {
        CINATRA_LOG_TRACE << "collect free client{" << client.get()
                          << "} enqueue";
        enqueue(free_clients_, std::move(client), pool_config_.idle_timeout);
      }
      else {
        CINATRA_LOG_TRACE << "out of max connection limit <<"
                          << pool_config_.max_connection
                          << ", collect free client{" << client.get()
                          << "} enqueue short connect queue";
        enqueue(short_connect_clients_, std::move(client),
                pool_config_.short_connect_idle_timeout);
      }
      is_alive_ = true;
    }
    else {
      CINATRA_LOG_TRACE << "client{" << client.get()
                        << "} is closed. we won't collect it";
    }

    return;
  }